

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_31baf::Boid::reset(Boid *this)

{
  ProximityToken *pPVar1;
  undefined1 auVar2 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  Vec3 VVar7;
  undefined8 local_28;
  float local_20;
  undefined8 extraout_XMM0_Qb;
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])(this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(this);
  auVar4._4_12_ = extraout_XMM0._4_12_;
  auVar4._0_4_ = extraout_XMM0._0_4_ * 0.3;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])(auVar4._0_8_,this);
  VVar7 = OpenSteer::RandomVectorInUnitRadiusSphere();
  fVar5 = VVar7.z;
  auVar3._0_8_ = VVar7._0_8_;
  auVar3._8_8_ = extraout_XMM0_Qb;
  fVar6 = SQRT(fVar5 * fVar5 + VVar7.x * VVar7.x + VVar7.y * VVar7.y);
  if (0.0 < fVar6) {
    auVar2._4_4_ = fVar6;
    auVar2._0_4_ = fVar6;
    auVar2._8_4_ = fVar6;
    auVar2._12_4_ = fVar6;
    auVar4 = divps(auVar3,auVar2);
    auVar3._0_8_ = auVar4._0_8_;
  }
  local_20 = (float)(~-(uint)(0.0 < fVar6) & (uint)fVar5 |
                    (uint)(fVar5 / fVar6) & -(uint)(0.0 < fVar6));
  local_28 = auVar3._0_8_;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x11])(this,&local_28);
  VVar7 = OpenSteer::RandomVectorInUnitRadiusSphere();
  fVar5 = VVar7.z * 20.0;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[9])(this);
  pPVar1 = this->proximityToken;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  local_20 = fVar5;
  (*pPVar1->_vptr_AbstractTokenForProximityDatabase[2])(pPVar1,&local_28);
  return;
}

Assistant:

void reset (void)
        {
            // reset the vehicle
            SimpleVehicle::reset ();

            // steering force is clipped to this magnitude
            setMaxForce (27);

            // velocity is clipped to this magnitude
            setMaxSpeed (9);

            // initial slow speed
            setSpeed (maxSpeed() * 0.3f);

            // randomize initial orientation
            regenerateOrthonormalBasisUF (RandomUnitVector ());

            // randomize initial position
            setPosition (RandomVectorInUnitRadiusSphere () * 20);

            // notify proximity database that our position has changed
            proximityToken->updateForNewPosition (position());
        }